

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall json::Value::free(Value *this,void *__ptr)

{
  vector<json::Value::Ref,_std::allocator<json::Value::Ref>_> *this_00;
  unordered_map<wasm::IString,_json::Value::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>_>
  *this_01;
  Value *this_local;
  
  if (this->type == Array) {
    this_00 = (this->field_1).arr;
    if (this_00 != (vector<json::Value::Ref,_std::allocator<json::Value::Ref>_> *)0x0) {
      std::vector<json::Value::Ref,_std::allocator<json::Value::Ref>_>::~vector(this_00);
      operator_delete(this_00,0x18);
    }
    (this->field_1).str.str._M_len = 0;
  }
  else if (this->type == Object) {
    this_01 = (unordered_map<wasm::IString,_json::Value::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>_>
               *)(this->field_1).arr;
    if (this_01 !=
        (unordered_map<wasm::IString,_json::Value::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>_>
         *)0x0) {
      std::
      unordered_map<wasm::IString,_json::Value::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>_>
      ::~unordered_map(this_01);
      operator_delete(this_01,0x38);
    }
    (this->field_1).str.str._M_len = 0;
  }
  this->type = Null;
  (this->field_1).str.str._M_len = 0;
  return;
}

Assistant:

void free() {
    if (type == Array) {
      delete arr;
      arr = nullptr;
    } else if (type == Object) {
      delete obj;
      obj = nullptr;
    }
    type = Null;
    num = 0;
  }